

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

value class_static_get(klass cls,char *key)

{
  set_value pvVar1;
  set_value in_RSI;
  undefined8 *in_RDI;
  value v;
  attribute attr;
  accessor_type accessor;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  set in_stack_ffffffffffffffc8;
  undefined4 local_28 [2];
  set_value local_20;
  set_value local_18;
  undefined8 *local_10;
  value local_8;
  
  if ((((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x10) == 0)) ||
     (in_RSI == (set_value)0x0)) {
    local_8 = (value)0x0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    pvVar1 = set_get(in_stack_ffffffffffffffc8,
                     (set_key)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (pvVar1 == (set_value)0x0) {
      if (*(int *)(local_10 + 1) == 0) {
        log_write_impl_va("metacall",0x1f7,"class_static_get",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                          ,LOG_LEVEL_ERROR,"Static attribute %s in class %s is not defined",local_18
                          ,*local_10);
        return (value)0x0;
      }
      if (*(int *)(local_10 + 1) == 1) {
        local_20 = local_18;
      }
      local_28[0] = 1;
    }
    else {
      local_28[0] = 0;
      local_20 = pvVar1;
    }
    local_8 = (value)(**(code **)(local_10[3] + 0x10))(local_10,local_10[2],local_28);
    if (local_8 == (value)0x0) {
      log_write_impl_va("metacall",0x20c,"class_static_get",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,LOG_LEVEL_ERROR,"Invalid class %s get of static attribute %s",*local_10,
                        local_18);
    }
  }
  return local_8;
}

Assistant:

value class_static_get(klass cls, const char *key)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->static_get != NULL && key != NULL)
	{
		struct accessor_type accessor;
		attribute attr = set_get(cls->static_attributes, (set_key)key);

		if (attr == NULL)
		{
			switch (cls->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Static attribute %s in class %s is not defined", key, cls->name);
					return NULL;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		value v = cls->interface->static_get(cls, cls->impl, &accessor);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s get of static attribute %s", cls->name, key);
		}

		return v;
	}

	return NULL;
}